

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReshapeStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapestatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x474) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x474;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    ReshapeStaticLayerParams::ReshapeStaticLayerParams(this_00.reshapestatic_);
    (this->layer_).reshapestatic_ = (ReshapeStaticLayerParams *)this_00;
  }
  return (ReshapeStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeStaticLayerParams* NeuralNetworkLayer::mutable_reshapestatic() {
  if (!has_reshapestatic()) {
    clear_layer();
    set_has_reshapestatic();
    layer_.reshapestatic_ = new ::CoreML::Specification::ReshapeStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeStatic)
  return layer_.reshapestatic_;
}